

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.h
# Opt level: O2

void arangodb::velocypack::Collection::keys
               (Slice slice,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result)

{
  string_view sVar1;
  uint8_t *local_58;
  size_t local_50;
  ObjectIterator it;
  
  ObjectIterator::ObjectIterator(&it,slice,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(result,it._size);
  while (it._position != it._size) {
    local_58 = (uint8_t *)ObjectIterator::key(&it,true);
    sVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       &local_58);
    local_58 = (uint8_t *)sVar1._M_str;
    local_50 = sVar1._M_len;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*,unsigned_long>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
               (char **)&local_58,&local_50);
    ObjectIterator::next(&it);
  }
  return;
}

Assistant:

static void keys(Slice slice, std::vector<std::string>& result) {
    // pre-allocate result vector
    ObjectIterator it(slice, /*useSequentialIteration*/ false);
    result.reserve(checkOverflow(it.size()));

    while (it.valid()) {
      std::string_view sv = it.key(true).stringView();
      result.emplace_back(sv.data(), sv.size());
      it.next();
    }
  }